

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExternalCodeEditor_UNIX.cxx
# Opt level: O1

int __thiscall ExternalCodeEditor::open_editor(ExternalCodeEditor *this,char *editor_cmd,char *code)

{
  bool bVar1;
  int iVar2;
  pid_t pVar3;
  char *pcVar4;
  int *piVar5;
  size_t __n;
  size_t sVar6;
  char *pcVar7;
  int unaff_EBP;
  char *fmt;
  stat sbuf;
  stat64 local_c0;
  
  if (this->filename_ == (char *)0x0) {
    pcVar4 = tmp_filename(this);
    set_filename(this,pcVar4);
    if (this->filename_ == (char *)0x0) {
      return -1;
    }
  }
  iVar2 = stat64(this->filename_,&local_c0);
  if (((-1 < iVar2) && ((local_c0.st_mode & 0xf000) == 0x8000)) && (this->pid_ != -1)) {
    pVar3 = reap_editor(this);
    if (pVar3 == 0) {
      unaff_EBP = 0;
      fl_alert("Editor Already Open\n  file=\'%s\'\n  pid=%ld",this->filename_,(long)this->pid_);
      bVar1 = false;
    }
    else if (pVar3 == -1) {
      piVar5 = __errno_location();
      pcVar4 = strerror(*piVar5);
      bVar1 = false;
      fl_alert("ERROR: waitpid() failed: %s\nfile=\'%s\', pid=%ld",pcVar4,this->filename_,
               (long)this->pid_);
      unaff_EBP = -1;
    }
    else {
      if (G_debug != 0) {
        printf("*** REAPED EXTERNAL EDITOR: PID %ld\n",(long)pVar3);
      }
      pcVar4 = tmp_filename(this);
      set_filename(this,pcVar4);
      bVar1 = true;
    }
    if (!bVar1) {
      return unaff_EBP;
    }
  }
  pcVar4 = this->filename_;
  iVar2 = open64(pcVar4,0x41,0x1b6);
  if (iVar2 == -1) {
    piVar5 = __errno_location();
    pcVar7 = strerror(*piVar5);
    fmt = "ERROR: open() \'%s\': %s";
LAB_001828a5:
    fl_alert(fmt,pcVar4,pcVar7);
  }
  else {
    __n = strlen(code);
    sVar6 = write(iVar2,code,__n);
    if (sVar6 == 0xffffffffffffffff) {
      piVar5 = __errno_location();
      pcVar7 = strerror(*piVar5);
      fl_alert("ERROR: write() \'%s\': %s",pcVar4,pcVar7);
    }
    else {
      if (sVar6 == __n) {
        close(iVar2);
        iVar2 = stat64(this->filename_,&local_c0);
        if (-1 < iVar2) {
          this->file_mtime_ = local_c0.st_mtim.tv_sec;
          this->file_size_ = local_c0.st_size;
          iVar2 = start_editor(this,editor_cmd,this->filename_);
          if (-1 < iVar2) {
            return 0;
          }
          if (G_debug != 0) {
            puts("Editor failed to start");
            return -1;
          }
          return -1;
        }
        pcVar4 = this->filename_;
        piVar5 = __errno_location();
        pcVar7 = strerror(*piVar5);
        fmt = "ERROR: can\'t stat(\'%s\'): %s";
        goto LAB_001828a5;
      }
      fl_alert("ERROR: write() \'%s\': wrote only %lu bytes, expected %lu",pcVar4,sVar6,__n);
    }
    close(iVar2);
  }
  return -1;
}

Assistant:

int ExternalCodeEditor::open_editor(const char *editor_cmd,
                                    const char *code) {
  // Make sure a temp filename exists
  if ( !filename() ) {
    set_filename(tmp_filename());
    if ( !filename() ) return -1;
  }
  // See if tmpfile already exists or editor already open
  if ( is_file(filename()) ) {
    if ( is_editing() ) {
      // See if editor recently closed but not reaped; try to reap
      pid_t wpid = reap_editor();
      switch (wpid) {
        case -1:        // waitpid() failed
          fl_alert("ERROR: waitpid() failed: %s\nfile='%s', pid=%ld",
            strerror(errno), filename(), (long)pid_);
          return -1;
        case 0:         // process still running
          fl_alert("Editor Already Open\n  file='%s'\n  pid=%ld",
            filename(), (long)pid_);
          return 0;
        default:        // process reaped, wpid is pid reaped
          if ( G_debug )
            printf("*** REAPED EXTERNAL EDITOR: PID %ld\n", (long)wpid);
          break;        // fall thru to open new editor instance
      }
      // Reinstate tmp filename (reap_editor() clears it)
      set_filename(tmp_filename());
    }
  }
  if ( save_file(filename(), code) < 0 ) {
    return -1;  // errors were shown in dialog
  }
  // Update mtime/size from closed file
  struct stat sbuf;
  if ( stat(filename(), &sbuf) < 0 ) {
    fl_alert("ERROR: can't stat('%s'): %s", filename(), strerror(errno));
    return -1;
  }
  file_mtime_ = sbuf.st_mtime;
  file_size_  = sbuf.st_size;
  if ( start_editor(editor_cmd, filename()) < 0 ) { // open file in external editor
    if ( G_debug ) printf("Editor failed to start\n");
    return -1;  // errors were shown in dialog
  }
  return 0;
}